

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_reader.cpp
# Opt level: O3

uchar copy_to_mem(FILE *fp,Elf32_Ehdr *elf_hdr,uchar *rom_mem)

{
  ushort uVar1;
  uint uVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  void *__ptr_01;
  long lVar4;
  ushort uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  char *__s;
  size_t __size;
  uint local_34 [2];
  uint insn;
  
  uVar5 = elf_hdr->e_shnum;
  uVar1 = elf_hdr->e_shentsize;
  uVar10 = elf_hdr->e_shoff;
  fseek((FILE *)fp,
        (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
        ,0);
  sVar9 = (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8) * (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
  __ptr = malloc(sVar9);
  sVar9 = fread(__ptr,sVar9,1,(FILE *)fp);
  __s = "error!! read elf";
  if (sVar9 == 1) {
    uVar10 = elf_hdr->e_phoff;
    if (uVar10 == 0) {
      __ptr_00 = (void *)0x0;
      uVar5 = 0;
    }
    else {
      uVar5 = elf_hdr->e_phnum << 8 | elf_hdr->e_phnum >> 8;
      __size = (ulong)(ushort)(elf_hdr->e_phentsize << 8 | elf_hdr->e_phentsize >> 8) * (ulong)uVar5
      ;
      __ptr_00 = malloc(__size);
      fseek((FILE *)fp,
            (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18),0);
      sVar9 = fread(__ptr_00,1,__size,(FILE *)fp);
      if (sVar9 != __size) {
        __s = "error!! read elf error";
        goto LAB_00103b94;
      }
    }
    uVar3 = (ulong)(ushort)(elf_hdr->e_shstrndx << 8 | elf_hdr->e_shstrndx >> 8);
    uVar10 = *(uint *)((long)__ptr + uVar3 * 0x28 + 0x10);
    fseek((FILE *)fp,
          (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                 uVar10 << 0x18),0);
    uVar10 = *(uint *)((long)__ptr + uVar3 * 0x28 + 0x14);
    __s = "error!! read elf";
    sVar9 = (size_t)(int)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
    __ptr_01 = malloc(sVar9);
    sVar9 = fread(__ptr_01,sVar9,1,(FILE *)fp);
    if (sVar9 == 1) {
      lVar4 = 0;
      do {
        if (((*(byte *)((long)__ptr + lVar4 * 0x28 + 7) & 1) != 0) &&
           ((*(byte *)((long)__ptr + lVar4 * 0x28 + 0xb) & 2) != 0)) {
          uVar10 = *(uint *)((long)__ptr + lVar4 * 0x28 + 0xc);
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          if (uVar5 != 0) {
            lVar6 = 0;
            do {
              uVar8 = *(uint *)((long)__ptr_00 + lVar6 + 4);
              if (uVar8 != 0) {
                uVar7 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18;
                uVar8 = *(uint *)((long)__ptr + lVar4 * 0x28 + 0x10);
                uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18;
                if ((uVar7 <= uVar8) &&
                   (uVar2 = *(uint *)((long)__ptr_00 + lVar6 + 0x14),
                   uVar8 < (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18) + uVar7)) {
                  uVar10 = *(uint *)((long)__ptr_00 + lVar6 + 0xc);
                  uVar10 = (uVar8 - uVar7) +
                           (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                           uVar10 << 0x18);
                }
              }
              lVar6 = lVar6 + 0x20;
            } while ((ulong)uVar5 * 0x20 != lVar6);
          }
          uVar8 = *(uint *)((long)__ptr + lVar4 * 0x28 + 0x10);
          uVar7 = *(uint *)((long)__ptr + lVar4 * 0x28 + 0x14);
          fseek((FILE *)fp,
                (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18),0);
          if (uVar7 != 0) {
            uVar8 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
            do {
              sVar9 = fread(local_34,4,1,(FILE *)fp);
              if (sVar9 == 0) break;
              uVar7 = local_34[0] >> 0x18 | (local_34[0] & 0xff0000) >> 8 |
                      (local_34[0] & 0xff00) << 8 | local_34[0] << 0x18;
              rom_mem[uVar10] = (uchar)local_34[0];
              rom_mem[uVar10 + 1] = (uchar)((local_34[0] & 0xff00) >> 8);
              rom_mem[uVar10 + 2] = (uchar)((local_34[0] & 0xff0000) >> 0x10);
              rom_mem[uVar10 + 3] = (uchar)(local_34[0] >> 0x18);
              uVar10 = uVar10 + 4;
              uVar8 = uVar8 - 4;
              local_34[0] = uVar7;
            } while (uVar8 != 0);
          }
        }
        lVar4 = lVar4 + 1;
      } while( true );
    }
  }
LAB_00103b94:
  puts(__s);
  return '\0';
}

Assistant:

unsigned char copy_to_mem(FILE *fp, Elf32_Ehdr *elf_hdr, unsigned char *rom_mem)
{
    Elf32_Shdr *elf_shdr_array;
	unsigned short num_section_header = 0;
	unsigned short size_section_header = 0;
    struct elf32_phdr *elf_phdata = NULL;
	unsigned int padd = 0;
	unsigned int freemem_addr = 0;
	unsigned int sectsize = 0;
	unsigned int insn;

    num_section_header = CONVERT_SHORT(elf_hdr->e_shnum);
	size_section_header = CONVERT_SHORT(elf_hdr->e_shentsize);
	fseek(fp, CONVERT_INT(elf_hdr->e_shoff), SEEK_SET);
	elf_shdr_array = (Elf32_Shdr *)malloc(size_section_header*num_section_header);

    if (fread(elf_shdr_array, size_section_header*num_section_header, 1, fp) != 1)
	{
		printf("error!! read elf\n");
		return false;
	}

	unsigned short phnum = 0;
	unsigned short phentsize = 0;
	//load segment
	if(CONVERT_INT(elf_hdr->e_phoff))
	{
		phnum = CONVERT_SHORT(elf_hdr->e_phnum);
		phentsize = CONVERT_SHORT(elf_hdr->e_phentsize);

		elf_phdata = (struct elf32_phdr *)malloc(phnum * phentsize);

		fseek(fp, CONVERT_INT(elf_hdr->e_phoff), SEEK_SET);

		if (fread(elf_phdata, 1, phnum*phentsize, fp) != phnum*phentsize)
		{
			printf("error!! read elf error\n");
			return false;
		}
	}

	//section name table
	unsigned short shstrndx = CONVERT_SHORT(elf_hdr->e_shstrndx);
	fseek(fp, CONVERT_INT(elf_shdr_array[shstrndx].sh_offset), SEEK_SET);
	char * shstrtab = (char *)malloc(CONVERT_INT(elf_shdr_array[shstrndx].sh_size));
	if (fread(shstrtab, CONVERT_INT(elf_shdr_array[shstrndx].sh_size), 1, fp) != 1)
	{
		printf("error!! read elf\n");
		return false;
	}

	for(int i = 0; i<num_section_header; i++)
	{
#ifdef __PRINT_DEBUG__
		unsigned int name_index = CONVERT_INT(elf_shdr_array[i].sh_name);
		printf("name = %s\n", shstrtab + name_index);
#endif
		if( (CONVERT_INT(elf_shdr_array[i].sh_type) & SHT_PROGBITS) && (CONVERT_INT(elf_shdr_array[i].sh_flags) & SHF_ALLOC) )
		{
			//segment covers section
			padd = CONVERT_INT(elf_shdr_array[i].sh_addr);
			for(int j = 0; j<phnum; j++)
			{
				if(CONVERT_INT(elf_phdata[j].p_offset) && 
					(CONVERT_INT(elf_phdata[j].p_offset) <= CONVERT_INT(elf_shdr_array[i].sh_offset)) &&
					((CONVERT_INT(elf_phdata[j].p_offset) + CONVERT_INT(elf_phdata[j].p_memsz)) > CONVERT_INT(elf_shdr_array[i].sh_offset)) )
				padd = CONVERT_INT(elf_phdata[j].p_paddr) + CONVERT_INT(elf_shdr_array[i].sh_offset) - CONVERT_INT(elf_phdata[j].p_offset);
			}

			freemem_addr = padd;
			sectsize = CONVERT_INT(elf_shdr_array[i].sh_size);

			fseek(fp, CONVERT_INT(elf_shdr_array[i].sh_offset), SEEK_SET);

			while(sectsize>0 && fread(&insn, sizeof(insn), 1, fp))
			{
				insn = CONVERT_INT(insn);
				//add program to program mem
				//based on section
				add_program(freemem_addr, insn, rom_mem);
#ifdef __PRINT_DEBUG__
				printf("0x%02x%02x%02x%02x\n", program_mem[freemem+0], program_mem[freemem+1], program_mem[freemem+2], program_mem[freemem+3]);
#endif
				sectsize-=4;
				freemem_addr+=4;
			}

		}
	}
    
}